

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token,string *decoded)

{
  Location pCVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  uint cp;
  Location end;
  uint unicode;
  string local_68;
  OurReader *local_48;
  Location local_40;
  uint local_34;
  
  std::__cxx11::string::reserve((ulong)decoded);
  end = token->end_ + -1;
  local_40 = token->start_ + 1;
  local_48 = this;
joined_r0x0011f5d5:
  do {
    if (local_40 == end) {
      return true;
    }
    pCVar1 = local_40 + 1;
    cVar2 = *local_40;
    if (cVar2 != '\\') {
      local_40 = pCVar1;
      if (cVar2 == '\"') {
        return true;
      }
      goto LAB_0011f607;
    }
    if (pCVar1 == end) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_40 = pCVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Empty escape sequence in string","");
      addError(local_48,&local_68,token,pCVar1);
      goto LAB_0011f753;
    }
    pCVar1 = local_40 + 2;
    bVar3 = local_40[1];
    local_40 = pCVar1;
    if (bVar3 < 0x62) {
      if (((bVar3 != 0x22) && (bVar3 != 0x2f)) && (bVar3 != 0x5c)) goto switchD_0011f660_caseD_6f;
      goto LAB_0011f607;
    }
    switch(bVar3) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_0011f660_caseD_6f:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Bad escape sequence in string","");
      addError(local_48,&local_68,token,pCVar1);
LAB_0011f753:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      return false;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      goto switchD_0011f660_caseD_75;
    default:
      if ((bVar3 != 0x62) && (bVar3 != 0x66)) goto switchD_0011f660_caseD_6f;
    }
LAB_0011f607:
    pCVar1 = local_40;
    std::__cxx11::string::push_back((char)decoded);
    local_40 = pCVar1;
  } while( true );
switchD_0011f660_caseD_75:
  bVar4 = decodeUnicodeCodePoint(local_48,token,&local_40,end,&local_34);
  if (!bVar4) {
    return false;
  }
  codePointToUTF8_abi_cxx11_(&local_68,(Json *)(ulong)local_34,cp);
  std::__cxx11::string::_M_append((char *)decoded,(ulong)local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  goto joined_r0x0011f5d5;
}

Assistant:

bool OurReader::decodeString(Token& token, std::string& decoded) {
  decoded.reserve(token.end_ - token.start_ - 2);
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}